

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcOrderAction::~IfcOrderAction(IfcOrderAction *this,void **vtt)

{
  void **vtt_local;
  IfcOrderAction *this_local;
  
  *(void **)&this->super_IfcTask = *vtt;
  *(void **)(&(this->super_IfcTask).field_0x0 + *(long *)(*(long *)&this->super_IfcTask + -0x18)) =
       vtt[0x21];
  *(void **)&(this->super_IfcTask).field_0x88 = vtt[0x22];
  *(void **)&(this->super_IfcTask).field_0x98 = vtt[0x23];
  *(void **)&(this->super_IfcTask).field_0xd0 = vtt[0x24];
  (this->super_IfcTask).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTask,_5UL>._vptr_ObjectHelper
       = (_func_int **)vtt[0x25];
  *(void **)&(this->super_IfcTask).field_0x190 = vtt[0x26];
  std::__cxx11::string::~string((string *)&(this->super_IfcTask).field_0x1a0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcOrderAction,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcOrderAction,_1UL> *)
             &(this->super_IfcTask).field_0x190,vtt + 0x1f);
  IfcTask::~IfcTask(&this->super_IfcTask,vtt + 1);
  return;
}

Assistant:

IfcOrderAction() : Object("IfcOrderAction") {}